

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

string * __thiscall
tinyformat::format<unsigned_short,std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,unsigned_short *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  ostringstream oss;
  ostringstream local_1e0 [112];
  ios_base local_170 [264];
  FormatArg *local_68;
  undefined4 local_60;
  FormatArg local_58;
  unsigned_short *local_40;
  code *local_38;
  code *local_30;
  
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  local_68 = &local_58;
  local_60 = 2;
  local_58.m_formatImpl = detail::FormatArg::formatImpl<unsigned_short>;
  local_58.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_short>;
  local_38 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_58.m_value = fmt;
  local_40 = args;
  detail::formatImpl((ostream *)local_1e0,(char *)this,local_68,2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  std::ios_base::~ios_base(local_170);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}